

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool __thiscall testing::internal::ExpectationBase::IsOverSaturated(ExpectationBase *this)

{
  uint uVar1;
  CardinalityInterface *pCVar2;
  byte bVar3;
  int iVar4;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  uVar1 = this->call_count_;
  pCVar2 = (this->cardinality_).impl_.value_;
  iVar4 = (*pCVar2->_vptr_CardinalityInterface[5])(pCVar2,(ulong)uVar1);
  if ((char)iVar4 == '\0') {
    bVar3 = 0;
  }
  else {
    pCVar2 = (this->cardinality_).impl_.value_;
    iVar4 = (*pCVar2->_vptr_CardinalityInterface[4])(pCVar2,(ulong)uVar1);
    bVar3 = (byte)iVar4 ^ 1;
  }
  return (bool)bVar3;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    return cardinality().IsOverSaturatedByCallCount(call_count_);
  }